

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_int32 *
ma_dr_flac__full_read_and_close_s32
          (ma_dr_flac *pFlac,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalPCMFrameCountOut)

{
  ma_allocation_callbacks *pAllocationCallbacks;
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  size_t sVar4;
  ma_int32 *pmVar5;
  size_t sVar6;
  ma_uint64 mVar7;
  ma_uint64 mVar8;
  ma_int32 *pmVar9;
  long lVar10;
  ma_uint64 mVar11;
  bool bVar12;
  ma_int32 buffer [4096];
  ma_int32 *local_4070;
  ma_int32 local_4038 [4098];
  
  if (pFlac->totalPCMFrameCount == 0) {
    pAllocationCallbacks = &pFlac->allocationCallbacks;
    p_Var1 = (pFlac->allocationCallbacks).onMalloc;
    if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      p_Var2 = (pFlac->allocationCallbacks).onRealloc;
      if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        local_4070 = (ma_int32 *)0x0;
      }
      else {
        local_4070 = (ma_int32 *)(*p_Var2)((void *)0x0,0x4000,pAllocationCallbacks->pUserData);
      }
    }
    else {
      local_4070 = (ma_int32 *)(*p_Var1)(0x4000,pAllocationCallbacks->pUserData);
    }
    if (local_4070 == (ma_int32 *)0x0) {
      local_4070 = (ma_int32 *)0x0;
      bVar12 = false;
      mVar7 = 0;
    }
    else {
      mVar8 = ma_dr_flac_read_pcm_frames_s32
                        (pFlac,SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) /
                                      ZEXT116(pFlac->channels),0),local_4038);
      if (mVar8 == 0) {
        sVar6 = 0x4000;
        mVar11 = 0;
      }
      else {
        sVar6 = 0x4000;
        mVar7 = 0;
        do {
          mVar11 = mVar8 + mVar7;
          if (sVar6 < pFlac->channels * mVar11 * 4) {
            pmVar9 = (ma_int32 *)
                     ma_dr_flac__realloc_from_callbacks
                               (local_4070,sVar6 * 2,sVar6,pAllocationCallbacks);
            bVar12 = pmVar9 != (ma_int32 *)0x0;
            sVar4 = sVar6 * 2;
            pmVar5 = pmVar9;
            if (((!bVar12) && (sVar4 = sVar6, pmVar5 = local_4070, local_4070 != (ma_int32 *)0x0))
               && (p_Var3 = (pFlac->allocationCallbacks).onFree,
                  p_Var3 != (_func_void_void_ptr_void_ptr *)0x0)) {
              (*p_Var3)(local_4070,pAllocationCallbacks->pUserData);
            }
            local_4070 = pmVar5;
            sVar6 = sVar4;
            if (pmVar9 == (ma_int32 *)0x0) goto LAB_00158354;
          }
          memcpy(local_4070 + mVar7 * pFlac->channels,local_4038,mVar8 * pFlac->channels * 4);
          mVar8 = ma_dr_flac_read_pcm_frames_s32
                            (pFlac,SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) /
                                          ZEXT116(pFlac->channels),0),local_4038);
          mVar7 = mVar11;
        } while (mVar8 != 0);
      }
      lVar10 = pFlac->channels * mVar11;
      memset(local_4070 + lVar10,0,sVar6 + lVar10 * -4);
      bVar12 = true;
      mVar7 = mVar11;
    }
LAB_00158354:
    if (!bVar12) goto LAB_0015835c;
  }
  else {
    sVar6 = (ulong)pFlac->channels * pFlac->totalPCMFrameCount * 4;
    p_Var1 = (pFlac->allocationCallbacks).onMalloc;
    if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      p_Var2 = (pFlac->allocationCallbacks).onRealloc;
      if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        local_4070 = (ma_int32 *)0x0;
      }
      else {
        local_4070 = (ma_int32 *)(*p_Var2)((void *)0x0,sVar6,(pFlac->allocationCallbacks).pUserData)
        ;
      }
    }
    else {
      local_4070 = (ma_int32 *)(*p_Var1)(sVar6,(pFlac->allocationCallbacks).pUserData);
    }
    if (local_4070 == (ma_int32 *)0x0) {
LAB_0015835c:
      local_4070 = (ma_int32 *)0x0;
      goto LAB_0015835e;
    }
    mVar7 = ma_dr_flac_read_pcm_frames_s32(pFlac,pFlac->totalPCMFrameCount,local_4070);
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = pFlac->sampleRate;
  }
  if (channelsOut != (uint *)0x0) {
    *channelsOut = (uint)pFlac->channels;
  }
  if (totalPCMFrameCountOut != (ma_uint64 *)0x0) {
    *totalPCMFrameCountOut = mVar7;
  }
LAB_0015835e:
  ma_dr_flac_close(pFlac);
  return local_4070;
}

Assistant:

ma_int32* ma_dr_flac_open_and_read_pcm_frames_s32(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalPCMFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalPCMFrameCountOut) {
        *totalPCMFrameCountOut = 0;
    }
    pFlac = ma_dr_flac_open(onRead, onSeek, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s32(pFlac, channelsOut, sampleRateOut, totalPCMFrameCountOut);
}